

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O0

int __thiscall ComplexType::fromBuffer(ComplexType *this,uint8_t *buf,size_t max_len)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  ComplexType local_80;
  int used_length;
  shared_ptr<BER_CONTAINER> newObj;
  pointer psStack_40;
  ASN_TYPE valueType;
  size_t i;
  uint8_t *ptr;
  int j;
  size_t max_len_local;
  uint8_t *buf_local;
  ComplexType *this_local;
  
  iVar2 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < iVar2) {
    i = (size_t)(buf + iVar2);
    psStack_40 = (pointer)0x1;
    do {
      if ((pointer)(long)(this->super_BER_CONTAINER)._length <= psStack_40 || max_len < psStack_40)
      {
        return (this->super_BER_CONTAINER)._length + 2;
      }
      newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           (ASN_TYPE)*(byte *)i;
      createObjectForType((ComplexType *)&used_length,
                          newObj.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&used_length);
      if (bVar1) {
        peVar3 = Catch::clara::std::
                 __shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&used_length);
        local_80.values.
        super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (*peVar3->_vptr_BER_CONTAINER[4])(peVar3,i,max_len - (long)psStack_40);
        if ((int)local_80.values.
                 super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage < 0) {
          this_local._4_4_ = -0xd;
          local_80.values.
          super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        }
        else {
          addValueToList(&local_80,(shared_ptr<BER_CONTAINER> *)this);
          Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                    ((shared_ptr<BER_CONTAINER> *)&local_80);
          i = i + (long)(int)local_80.values.
                             super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
          psStack_40 = (pointer)((long)&(psStack_40->
                                        super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr +
                                (long)(int)local_80.values.
                                           super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_80.values.
          super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = -0xe;
        local_80.values.
        super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      }
      Catch::clara::std::shared_ptr<BER_CONTAINER>::~shared_ptr
                ((shared_ptr<BER_CONTAINER> *)&used_length);
      iVar2 = this_local._4_4_;
    } while (local_80.values.
             super__Vector_base<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0);
  }
  this_local._4_4_ = iVar2;
  return this_local._4_4_;
}

Assistant:

int ComplexType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* ptr = buf + j;

    size_t i = 1;
    while(i < (size_t)_length && i <= max_len){
        ASN_TYPE valueType = (ASN_TYPE)*ptr;

        auto newObj = ComplexType::createObjectForType(valueType);
        if(!newObj){
            SNMP_LOGD("Couldn't create object of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_UNKNOWN_TYPE;
        }

        int used_length = newObj->fromBuffer(ptr, max_len - i);
        if(used_length < 0){
            // Problem de-serialising
            SNMP_LOGD("Problem deserialising structure of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_PROBLEM_DESERIALISING;
        }

        addValueToList(newObj);

        ptr += used_length; 
        i += used_length;
    }
    return _length + 2;
}